

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall slang::syntax::MemberSyntax::getChild(MemberSyntax *this,size_t index)

{
  long in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  TokenOrSyntax *this_00;
  
  if (in_RDX == 0) {
    this_00 = (TokenOrSyntax *)0x0;
    if ((SyntaxNode *)(in_RSI + 0x18) != (SyntaxNode *)0x0) {
      this_00 = (TokenOrSyntax *)(in_RSI + 0x20);
    }
    TokenOrSyntax::TokenOrSyntax(this_00,(SyntaxNode *)(in_RSI + 0x18));
  }
  else {
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax MemberSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        default: return nullptr;
    }
}